

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_easy_ssls_export(CURL *d,curl_ssls_export_cb *export_fn,void *userptr)

{
  return CURLE_NOT_BUILT_IN;
}

Assistant:

CURLcode curl_easy_ssls_export(CURL *d,
                               curl_ssls_export_cb *export_fn,
                               void *userptr)
{
#ifdef USE_SSLS_EXPORT
  struct Curl_easy *data = d;
  if(!GOOD_EASY_HANDLE(data))
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return Curl_ssl_session_export(data, export_fn, userptr);
#else
  (void)d;
  (void)export_fn;
  (void)userptr;
  return CURLE_NOT_BUILT_IN;
#endif
}